

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O3

int __thiscall
pstore::sstring_view<char_const*>::compare<pstore::sstring_view<char_const*>>
          (sstring_view<char_const*> *this,sstring_view<const_char_*> *s)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = s->size_;
  uVar2 = *(ulong *)(this + 8);
  uVar4 = uVar2;
  if (uVar1 < uVar2) {
    uVar4 = uVar1;
  }
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      if (*(char *)(*(long *)this + uVar5) < s->ptr_[uVar5]) {
        return -1;
      }
      if (s->ptr_[uVar5] < *(char *)(*(long *)this + uVar5)) {
        return 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  uVar3 = 0;
  if (uVar2 != uVar1) {
    uVar3 = -(uint)(uVar2 < uVar1) | 1;
  }
  return uVar3;
}

Assistant:

size_type length () const noexcept { return size_; }